

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O2

Options * __thiscall
ApprovalTests::Options::withScrubber
          (Options *__return_storage_ptr__,Options *this,Scrubber *scrubber)

{
  _Manager_type p_Var1;
  Reporter *reporter;
  _Any_data local_78;
  _Manager_type local_68;
  _Invoker_type local_60;
  __shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2> local_58;
  undefined1 local_48 [40];
  
  FileOptions::FileOptions((FileOptions *)local_48,&this->fileOptions_);
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_68 = (_Manager_type)0x0;
  local_60 = scrubber->_M_invoker;
  p_Var1 = (scrubber->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_78._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(scrubber->super__Function_base)._M_functor;
    local_78._8_8_ = *(undefined8 *)((long)&(scrubber->super__Function_base)._M_functor + 8);
    (scrubber->super__Function_base)._M_manager = (_Manager_type)0x0;
    scrubber->_M_invoker = (_Invoker_type)0x0;
    local_68 = p_Var1;
  }
  reporter = this->reporter_;
  ::std::__shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_58,
             &(this->namer_).
              super___shared_ptr<ApprovalTests::ApprovalNamer,_(__gnu_cxx::_Lock_policy)2>);
  Options(__return_storage_ptr__,(FileOptions *)local_48,(Scrubber *)&local_78,reporter,false,
          (shared_ptr<ApprovalTests::ApprovalNamer> *)&local_58);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_78);
  ::std::__cxx11::string::~string((string *)(local_48 + 8));
  return __return_storage_ptr__;
}

Assistant:

Options Options::withScrubber(Scrubber scrubber) const
    {
        return Options(fileOptions_, std::move(scrubber), reporter_, false, namer_);
    }